

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O0

int Sim_SymmsIsCompatibleWithNodes(Abc_Ntk_t *pNtk,uint uSymm,Vec_Ptr_t *vNodesOther,int *pMap)

{
  Abc_Obj_t *pAVar1;
  bool bVar2;
  bool bVar3;
  int fIsVar2;
  int fIsVar1;
  int Ind2;
  int Ind1;
  int s;
  int i;
  Abc_Obj_t *pNode;
  Vec_Int_t *vSymmsNode;
  int *pMap_local;
  Vec_Ptr_t *vNodesOther_local;
  uint uSymm_local;
  Abc_Ntk_t *pNtk_local;
  
  if (vNodesOther->nSize != 0) {
    for (Ind1 = 0; Ind1 < vNodesOther->nSize; Ind1 = Ind1 + 1) {
      pAVar1 = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[Ind1]);
      bVar2 = (*(uint *)((long)pNtk->vSupps->pArray[pAVar1->Id] +
                        (long)((int)(uSymm & 0xffff) >> 5) * 4) &
              1 << ((byte)(uSymm & 0xffff) & 0x1f)) != 0;
      bVar3 = (*(uint *)((long)pNtk->vSupps->pArray[pAVar1->Id] +
                        (long)((int)(uSymm >> 0x10) >> 5) * 4) & 1 << ((byte)(uSymm >> 0x10) & 0x1f)
              ) != 0;
      if ((bVar2) || (bVar3)) {
        if (bVar2 != bVar3) {
          return 0;
        }
        pAVar1 = (pAVar1->field_6).pCopy;
        Ind2 = 0;
        while ((Ind2 < *(int *)((long)&pAVar1->pNtk + 4) &&
               (uSymm != *(uint *)((long)&pAVar1->pNext->pNtk + (long)Ind2 * 4)))) {
          Ind2 = Ind2 + 1;
        }
        if (Ind2 == *(int *)((long)&pAVar1->pNtk + 4)) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

int Sim_SymmsIsCompatibleWithNodes( Abc_Ntk_t * pNtk, unsigned uSymm, Vec_Ptr_t * vNodesOther, int * pMap )
{
    Vec_Int_t * vSymmsNode;
    Abc_Obj_t * pNode;
    int i, s, Ind1, Ind2, fIsVar1, fIsVar2;

    if ( vNodesOther->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the nodes
    // if they do not belong to a support, it is okay
    // if one belongs, the other does not belong, quit
    // if they belong, but are not part of symmetry, quit
    for ( i = 0; i < vNodesOther->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesOther->pArray[i]);
        fIsVar1 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind1 );
        fIsVar2 = Sim_SuppStrHasVar( pNtk->vSupps, pNode, Ind2 );

        if ( !fIsVar1 && !fIsVar2 )
            continue;
        if ( fIsVar1 ^ fIsVar2 )
            return 0;
        // both belong
        // check if there is a symmetry
        vSymmsNode = SIM_READ_SYMMS( pNode );
        for ( s = 0; s < vSymmsNode->nSize; s++ )
            if ( uSymm == (unsigned)vSymmsNode->pArray[s] )
                break;
        if ( s == vSymmsNode->nSize )
            return 0;
    }
    return 1;
}